

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O0

int spki_table_src_remove(spki_table *spki_table,rtr_socket *socket)

{
  long lVar1;
  void *ptr;
  void *pvVar2;
  long in_FS_OFFSET;
  tommy_node *local_38;
  tommy_node *current_node;
  key_entry *entry;
  rtr_socket *socket_local;
  spki_table *spki_table_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_rwlock_wrlock((pthread_rwlock_t *)&spki_table->lock);
  local_38 = tommy_list_head(&spki_table->list);
LAB_00111811:
  do {
    if (local_38 == (tommy_node *)0x0) {
      pthread_rwlock_unlock((pthread_rwlock_t *)&spki_table->lock);
      spki_table_local._4_4_ = 0;
LAB_001118e4:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return spki_table_local._4_4_;
    }
    ptr = local_38->data;
    if (*(rtr_socket **)((long)ptr + 0x78) == socket) {
      local_38 = local_38->next;
      pvVar2 = tommy_list_remove_existing(&spki_table->list,(tommy_node *)((long)ptr + 0xa0));
      if (pvVar2 == (void *)0x0) {
        pthread_rwlock_unlock((pthread_rwlock_t *)&spki_table->lock);
        spki_table_local._4_4_ = -1;
        goto LAB_001118e4;
      }
      pvVar2 = tommy_hashlin_remove_existing
                         (&spki_table->hashtable,(tommy_hashlin_node *)((long)ptr + 0x80));
      if (pvVar2 == (void *)0x0) {
        pthread_rwlock_unlock((pthread_rwlock_t *)&spki_table->lock);
        spki_table_local._4_4_ = -1;
        goto LAB_001118e4;
      }
      lrtr_free(ptr);
      goto LAB_00111811;
    }
    local_38 = local_38->next;
  } while( true );
}

Assistant:

int spki_table_src_remove(struct spki_table *spki_table, const struct rtr_socket *socket)
{
	struct key_entry *entry;
	tommy_node *current_node;

	pthread_rwlock_wrlock(&spki_table->lock);

	current_node = tommy_list_head(&spki_table->list);
	while (current_node) {
		entry = current_node->data;
		if (entry->socket == socket) {
			current_node = current_node->next;
			if (!tommy_list_remove_existing(&spki_table->list, &entry->list_node)) {
				pthread_rwlock_unlock(&spki_table->lock);
				return SPKI_ERROR;
			}
			if (!tommy_hashlin_remove_existing(&spki_table->hashtable, &entry->hash_node)) {
				pthread_rwlock_unlock(&spki_table->lock);
				return SPKI_ERROR;
			}
			lrtr_free(entry);
		} else {
			current_node = current_node->next;
		}
	}
	pthread_rwlock_unlock(&spki_table->lock);
	return SPKI_SUCCESS;
}